

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O1

void Saig_BmcInterval(Saig_Bmc_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  void **ppvVar7;
  Vec_Int_t *pVVar8;
  int iVar9;
  long lVar10;
  
  iVar1 = p->pFrm->vObjs->nSize;
  iVar2 = p->pFrm->nDeleted;
  p->vTargets->nSize = 0;
  iVar9 = p->iFrameLast;
  p->iFramePrev = iVar9;
  if (iVar9 < p->nFramesMax) {
    do {
      if (p->iOutputLast == 0) {
        Saig_BmcObjSetFrame(p,p->pAig->pConst1,iVar9,p->pFrm->pConst1);
      }
      uVar5 = p->iOutputLast;
      while (pAVar3 = p->pAig, (int)uVar5 < pAVar3->nTruePos) {
        if (p->nNodesMax + (iVar1 - iVar2) <= p->pFrm->vObjs->nSize - p->pFrm->nDeleted) {
          return;
        }
        pVVar8 = p->vVisited;
        pVVar8->nSize = 0;
        if (((int)uVar5 < 0) || (pVVar4 = pAVar3->vCos, pVVar4->nSize <= (int)uVar5)) {
LAB_00531376:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar6 = Saig_BmcIntervalConstruct_rec
                           (p,(Aig_Obj_t *)pVVar4->pArray[uVar5],p->iFrameLast,pVVar8);
        pVVar4 = p->vTargets;
        uVar5 = pVVar4->nCap;
        if (pVVar4->nSize == uVar5) {
          if ((int)uVar5 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar4->pArray,0x80);
            }
            pVVar4->pArray = ppvVar7;
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar5 * 2;
            if (iVar9 <= (int)uVar5) goto LAB_005312cc;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar4->pArray,(ulong)uVar5 << 4);
            }
            pVVar4->pArray = ppvVar7;
          }
          pVVar4->nCap = iVar9;
        }
LAB_005312cc:
        iVar9 = pVVar4->nSize;
        pVVar4->nSize = iVar9 + 1;
        pVVar4->pArray[iVar9] = pAVar6;
        Aig_ObjCreateCo(p->pFrm,pAVar6);
        Aig_ManCleanup(p->pFrm);
        pVVar8 = p->vVisited;
        if (1 < pVVar8->nSize) {
          lVar10 = 1;
          do {
            pVVar4 = p->pAig->vObjs;
            if (pVVar4 == (Vec_Ptr_t *)0x0) {
              pAVar6 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar5 = pVVar8->pArray[lVar10 + -1];
              if (((int)uVar5 < 0) || (pVVar4->nSize <= (int)uVar5)) goto LAB_00531376;
              pAVar6 = (Aig_Obj_t *)pVVar4->pArray[uVar5];
            }
            Saig_BmcObjFrame(p,pAVar6,pVVar8->pArray[lVar10]);
            pVVar8 = p->vVisited;
            lVar10 = lVar10 + 2;
          } while ((int)lVar10 < pVVar8->nSize);
        }
        uVar5 = p->iOutputLast + 1;
        p->iOutputLast = uVar5;
      }
      iVar9 = p->iFrameLast + 1;
      p->iFrameLast = iVar9;
      p->iOutputLast = 0;
    } while (iVar9 < p->nFramesMax);
  }
  return;
}

Assistant:

void Saig_BmcInterval( Saig_Bmc_t * p )
{
    Aig_Obj_t * pTarget;
    int i, iObj, iFrame;
    int nNodes = Aig_ManObjNum( p->pFrm );
    Vec_PtrClear( p->vTargets );
    p->iFramePrev = p->iFrameLast;
    for ( ; p->iFrameLast < p->nFramesMax; p->iFrameLast++, p->iOutputLast = 0 )
    { 
        if ( p->iOutputLast == 0 )
        {
            Saig_BmcObjSetFrame( p, Aig_ManConst1(p->pAig), p->iFrameLast, Aig_ManConst1(p->pFrm) );
        }
        for ( ; p->iOutputLast < Saig_ManPoNum(p->pAig); p->iOutputLast++ )
        {
            if ( Aig_ManObjNum(p->pFrm) >= nNodes + p->nNodesMax )
                return;
//            Saig_BmcIntervalExplore_rec( p, Aig_ManCo(p->pAig, p->iOutputLast), p->iFrameLast );
            Vec_IntClear( p->vVisited );
            pTarget = Saig_BmcIntervalConstruct_rec( p, Aig_ManCo(p->pAig, p->iOutputLast), p->iFrameLast, p->vVisited );
            Vec_PtrPush( p->vTargets, pTarget );
            Aig_ObjCreateCo( p->pFrm, pTarget );
            Aig_ManCleanup( p->pFrm ); // it is not efficient to cleanup the whole manager!!!
            // check if the node is gone
            Vec_IntForEachEntryDouble( p->vVisited, iObj, iFrame, i )
                Saig_BmcObjFrame( p, Aig_ManObj(p->pAig, iObj), iFrame );
            // it is not efficient to remove nodes, which may be used later!!!
        }
    }
}